

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void SerializeToVector<DataStream,CTxOut>(DataStream *s,CTxOut *args)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (args->scriptPubKey).super_CScriptBase._size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  lVar4 = 1;
  if (0xfc < uVar3) {
    lVar4 = (ulong)(0xffff < uVar3) * 2 + 3;
  }
  WriteCompactSize<DataStream>(s,(ulong)uVar3 + lVar4 + 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    SerializeMany<DataStream,long,CScript>(s,&args->nValue,&args->scriptPubKey);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeToVector(Stream& s, const X&... args)
{
    SizeComputer sizecomp;
    SerializeMany(sizecomp, args...);
    WriteCompactSize(s, sizecomp.size());
    SerializeMany(s, args...);
}